

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

int openssl_static_locks_install(void)

{
  LOGGER_LOG p_Var1;
  LOCK_HANDLE pvVar2;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar3;
  int local_3c;
  int j;
  LOGGER_LOG l_2;
  int i;
  LOGGER_LOG l_1;
  size_t malloc_size;
  LOGGER_LOG l;
  int result;
  
  if (openssl_locks == (LOCK_HANDLE *)0x0) {
    openssl_locks = (LOCK_HANDLE *)malloc(8);
    if (openssl_locks == (LOCK_HANDLE *)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                  ,"openssl_static_locks_install",0x267,1,"Failed to allocate locks, size:%zu",8);
      }
      l._4_4_ = 0x268;
    }
    else {
      for (l_2._4_4_ = 0; l_2._4_4_ < 1; l_2._4_4_ = l_2._4_4_ + 1) {
        pvVar2 = Lock_Init();
        uVar3 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
        openssl_locks[l_2._4_4_] = pvVar2;
        if (openssl_locks[l_2._4_4_] == (LOCK_HANDLE)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                      ,"openssl_static_locks_install",0x272,1,"Failed to allocate lock %d",
                      CONCAT44(uVar3,l_2._4_4_));
          }
          break;
        }
      }
      if (l_2._4_4_ == 1) {
        l._4_4_ = 0;
      }
      else {
        for (local_3c = 0; local_3c < l_2._4_4_; local_3c = local_3c + 1) {
          Lock_Deinit(openssl_locks[local_3c]);
        }
        l._4_4_ = 0x27e;
      }
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                ,"openssl_static_locks_install",0x25e,1,"Locks already initialized");
    }
    l._4_4_ = 0x25f;
  }
  return l._4_4_;
}

Assistant:

static int openssl_static_locks_install(void)
{
    int result;

    if (openssl_locks != NULL)
    {
        LogInfo("Locks already initialized");
        result = MU_FAILURE;
    }
    else
    {
        size_t malloc_size = safe_multiply_size_t(CRYPTO_num_locks(), sizeof(LOCK_HANDLE));
        if (malloc_size == SIZE_MAX ||
            (openssl_locks = malloc(malloc_size)) == NULL)
        {
            LogError("Failed to allocate locks, size:%zu", malloc_size);
            result = MU_FAILURE;
        }
        else
        {
            int i;
            for (i = 0; i < CRYPTO_num_locks(); i++)
            {
                openssl_locks[i] = Lock_Init();
                if (openssl_locks[i] == NULL)
                {
                    LogError("Failed to allocate lock %d", i);
                    break;
                }
            }

            if (i != CRYPTO_num_locks())
            {
                int j;
                for (j = 0; j < i; j++)
                {
                    Lock_Deinit(openssl_locks[j]);
                }
                result = MU_FAILURE;
            }
            else
            {
                CRYPTO_set_locking_callback(openssl_static_locks_lock_unlock_cb);

                result = 0;
            }
        }
    }
    return result;
}